

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_TestFailure_StringsEqualFailureWithText_TestShell::createTest
          (TEST_TestFailure_StringsEqualFailureWithText_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x10,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
                                  ,0xac);
  this_00->_vptr_Utest = (_func_int **)0x0;
  this_00[1]._vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_00355b78;
  return this_00;
}

Assistant:

TEST(TestFailure, StringsEqualFailureWithText)
{
    StringEqualFailure f(test, failFileName, failLineNumber, "abc", "abd", "text");
    FAILURE_EQUAL("Message: text\n"
                  "\texpected <abc>\n"
                  "\tbut was  <abd>\n"
                  "\tdifference starts at position 2 at: <        abd         >\n"
                  "\t                                               ^", f);
}